

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O3

void __thiscall
NaPetriNet::link_1n(NaPetriNet *this,NaPetriConnector *pcSrc,NaPetriConnector *pcDst1,...)

{
  char in_AL;
  long *plVar1;
  undefined4 *puVar2;
  uint uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list val;
  long *local_100;
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (pcSrc == (NaPetriConnector *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  local_100 = (long *)&stack0x00000008;
  uVar3 = 0x18;
  if (pcDst1 != (NaPetriConnector *)0x0) {
    do {
      (*this->_vptr_NaPetriNet[8])(this,pcSrc,pcDst1);
      uVar4 = (ulong)uVar3;
      if (uVar4 < 0x29) {
        uVar3 = uVar3 + 8;
        plVar1 = (long *)((long)local_e8 + uVar4);
      }
      else {
        plVar1 = local_100;
        local_100 = local_100 + 1;
      }
      pcDst1 = (NaPetriConnector *)*plVar1;
    } while (pcDst1 != (NaPetriConnector *)0x0);
  }
  return;
}

Assistant:

void
NaPetriNet::link_1n (NaPetriConnector* pcSrc, NaPetriConnector* pcDst1, ...)
{
  NaPetriConnector	*pcDst;
  va_list		val;
  const char		*szExMsg =
    "Broken link from '%s.%s' to '%s.%s'.\n"
    "Caused by exception: %s\n";

  if(NULL == pcSrc)
    throw(na_null_pointer);

  for(pcDst = pcDst1, va_start(val, pcDst1);
      NULL != pcDst;
      pcDst = va_arg(val, NaPetriConnector*)){
    try{
      link(pcSrc, pcDst);
    }catch(NaException exCode){
      NaPrintLog(szExMsg,
		 pcSrc->host()->name(), pcSrc->name(),
		 pcDst->host()->name(), pcDst->name(),
		 NaExceptionMsg(exCode));
    }
  }

  va_end(val);
}